

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigTests.cpp
# Opt level: O2

EGLint deqp::egl::ChooseConfigRandomCase::getSurfaceType(Random *rnd)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  
  bVar1 = de::Random::getBool(rnd);
  bVar2 = de::Random::getBool(rnd);
  bVar3 = de::Random::getBool(rnd);
  return (uint)bVar3 | (uint)bVar1 * 4 + (uint)bVar2 * 2;
}

Assistant:

static EGLint getSurfaceType (de::Random& rnd)
	{
		EGLint bits = 0;
		bits |= rnd.getBool() ? EGL_WINDOW_BIT	: 0;
		bits |= rnd.getBool() ? EGL_PIXMAP_BIT	: 0;
		bits |= rnd.getBool() ? EGL_PBUFFER_BIT	: 0;
		return bits;
	}